

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O1

void __thiscall
CryptoUtil_DecryptAes256CbcToString_Test::~CryptoUtil_DecryptAes256CbcToString_Test
          (CryptoUtil_DecryptAes256CbcToString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256CbcToString) {
  ByteData key(
      "3334353637383930313233343536373833343536373839303132333435363738");
  ByteData iv("33343536373839303132333435363738");
  ByteData data(
      "aaf07c2bce50048b41e931898ad647a38d91324abd47121aa4d625fbc2aeb3a8d57df4f18f25599a4c40a9a7c547479c");

  std::string result = CryptoUtil::DecryptAes256CbcToString(key.GetBytes(),
                                                            iv.GetBytes(),
                                                            data);
  EXPECT_STREQ(result.c_str(), "aiueoaiueoaiueoaiueoaiueoaiueoai");
}